

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_string.c
# Opt level: O0

wchar_t archive_string_append_from_wcs(archive_string *as,wchar_t *w,size_t len)

{
  char *pcVar1;
  size_t sVar2;
  archive_string *paVar3;
  size_t sVar4;
  int *piVar5;
  size_t local_78;
  mbstate_t local_48;
  mbstate_t_conflict shift_state;
  char *end;
  char *p;
  wchar_t ret_val;
  wchar_t n;
  size_t len_local;
  wchar_t *w_local;
  archive_string *as_local;
  
  p._0_4_ = L'\0';
  memset(&local_48,0,8);
  paVar3 = archive_string_ensure(as,as->length + len + 1);
  if (paVar3 == (archive_string *)0x0) {
    as_local._4_4_ = L'\xffffffff';
  }
  else {
    end = as->s + as->length;
    pcVar1 = as->s;
    sVar2 = as->buffer_length;
    sVar4 = __ctype_get_mb_cur_max();
    shift_state = (mbstate_t_conflict)((long)pcVar1 + (sVar2 - sVar4) + -1);
    len_local = (size_t)w;
    for (_ret_val = len; *(int *)len_local != 0 && _ret_val != 0; _ret_val = _ret_val - 1) {
      if ((ulong)shift_state <= end) {
        as->length = (long)end - (long)as->s;
        as->s[as->length] = '\0';
        sVar2 = as->length;
        sVar4 = __ctype_get_mb_cur_max();
        if (sVar4 < _ret_val << 1) {
          local_78 = _ret_val << 1;
        }
        else {
          local_78 = __ctype_get_mb_cur_max();
        }
        paVar3 = archive_string_ensure(as,sVar2 + local_78 + 1);
        if (paVar3 == (archive_string *)0x0) {
          return L'\xffffffff';
        }
        end = as->s + as->length;
        pcVar1 = as->s;
        sVar2 = as->buffer_length;
        sVar4 = __ctype_get_mb_cur_max();
        shift_state = (mbstate_t_conflict)((long)pcVar1 + (sVar2 - sVar4) + -1);
      }
      sVar4 = wcrtomb(end,*(wchar_t *)len_local,&local_48);
      if ((int)sVar4 == -1) {
        piVar5 = __errno_location();
        if (*piVar5 != 0x54) {
          p._0_4_ = L'\xffffffff';
          break;
        }
        *end = '?';
        p._0_4_ = L'\xffffffff';
        end = end + 1;
      }
      else {
        end = end + (int)sVar4;
      }
      len_local = len_local + 4;
    }
    as->length = (long)end - (long)as->s;
    as->s[as->length] = '\0';
    as_local._4_4_ = (wchar_t)p;
  }
  return as_local._4_4_;
}

Assistant:

int
archive_string_append_from_wcs(struct archive_string *as,
    const wchar_t *w, size_t len)
{
	/* We cannot use the standard wcstombs() here because it
	 * cannot tell us how big the output buffer should be.  So
	 * I've built a loop around wcrtomb() or wctomb() that
	 * converts a character at a time and resizes the string as
	 * needed.  We prefer wcrtomb() when it's available because
	 * it's thread-safe. */
	int n, ret_val = 0;
	char *p;
	char *end;
#if HAVE_WCRTOMB
	mbstate_t shift_state;

	memset(&shift_state, 0, sizeof(shift_state));
#else
	/* Clear the shift state before starting. */
	wctomb(NULL, L'\0');
#endif
	/*
	 * Allocate buffer for MBS.
	 * We need this allocation here since it is possible that
	 * as->s is still NULL.
	 */
	if (archive_string_ensure(as, as->length + len + 1) == NULL)
		return (-1);

	p = as->s + as->length;
	end = as->s + as->buffer_length - MB_CUR_MAX -1;
	while (*w != L'\0' && len > 0) {
		if (p >= end) {
			as->length = p - as->s;
			as->s[as->length] = '\0';
			/* Re-allocate buffer for MBS. */
			if (archive_string_ensure(as,
			    as->length + max(len * 2,
			    (size_t)MB_CUR_MAX) + 1) == NULL)
				return (-1);
			p = as->s + as->length;
			end = as->s + as->buffer_length - MB_CUR_MAX -1;
		}
#if HAVE_WCRTOMB
		n = wcrtomb(p, *w++, &shift_state);
#else
		n = wctomb(p, *w++);
#endif
		if (n == -1) {
			if (errno == EILSEQ) {
				/* Skip an illegal wide char. */
				*p++ = '?';
				ret_val = -1;
			} else {
				ret_val = -1;
				break;
			}
		} else
			p += n;
		len--;
	}
	as->length = p - as->s;
	as->s[as->length] = '\0';
	return (ret_val);
}